

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O2

bool __thiscall
prometheus::Registry::Remove<prometheus::Summary>
          (Registry *this,Family<prometheus::Summary> *family)

{
  unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>
  *puVar1;
  __normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_*,_std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>_>
  __position;
  
  std::mutex::lock(&this->mutex_);
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>*,std::vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>,std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>>>>,__gnu_cxx::__ops::_Iter_pred<prometheus::Registry::Remove<prometheus::Summary>(prometheus::Family<prometheus::Summary>const&)::_lambda(std::unique_ptr<prometheus::Family<prometheus::Summary>,std::default_delete<prometheus::Family<prometheus::Summary>>>const&)_1_>>
                         ((this->summaries_).
                          super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->summaries_).
                          super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,family);
  puVar1 = (this->summaries_).
           super__Vector_base<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != puVar1) {
    std::
    vector<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>,_std::allocator<std::unique_ptr<prometheus::Family<prometheus::Summary>,_std::default_delete<prometheus::Family<prometheus::Summary>_>_>_>_>
    ::erase(&this->summaries_,(const_iterator)__position._M_current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return __position._M_current != puVar1;
}

Assistant:

bool Registry::Remove(const Family<T>& family) {
  std::lock_guard<std::mutex> lock{mutex_};

  auto& families = GetFamilies<T>();
  auto same_family = [&family](const std::unique_ptr<Family<T>>& in) {
    return &family == in.get();
  };

  auto it = std::find_if(families.begin(), families.end(), same_family);
  if (it == families.end()) {
    return false;
  }

  families.erase(it);
  return true;
}